

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::ShowMetricsWindow::Funcs::NodeWindows(ImVector<ImGuiWindow_*> *windows,char *label)

{
  bool bVar1;
  long lVar2;
  
  bVar1 = TreeNode(label,"%s (%d)",label,(ulong)(uint)windows->Size);
  if (!bVar1) {
    return;
  }
  if (0 < windows->Size) {
    lVar2 = 0;
    do {
      PushID(windows->Data[lVar2]);
      if (windows->Size <= lVar2) {
        __assert_fail("i < Size",
                      "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imgui.h"
                      ,0x52e,"T &ImVector<ImGuiWindow *>::operator[](int) [T = ImGuiWindow *]");
      }
      NodeWindow(windows->Data[lVar2],"Window");
      PopID();
      lVar2 = lVar2 + 1;
    } while (lVar2 < windows->Size);
  }
  TreePop();
  return;
}

Assistant:

static void NodeWindows(ImVector<ImGuiWindow*>& windows, const char* label)
        {
            if (!ImGui::TreeNode(label, "%s (%d)", label, windows.Size))
                return;
            for (int i = 0; i < windows.Size; i++)
            {
                ImGui::PushID(windows[i]);
                Funcs::NodeWindow(windows[i], "Window");
                ImGui::PopID();
            }
            ImGui::TreePop();
        }